

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_create_collation16
              (sqlite3 *db,void *zName,int enc,void *pCtx,
              _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare)

{
  sqlite3 *db_00;
  sqlite3 *in_RCX;
  _func_void_void_ptr *in_RSI;
  _func_int_void_ptr_int_void_ptr_int_void_ptr *in_RDI;
  void *in_R8;
  char *zName8;
  int rc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  
  iVar1 = 0;
  sqlite3_mutex_enter((sqlite3_mutex *)0x14dc44);
  db_00 = (sqlite3 *)
          sqlite3Utf16to8(in_RCX,in_R8,iVar1,(u8)((uint)in_stack_ffffffffffffffd0 >> 0x18));
  if (db_00 != (sqlite3 *)0x0) {
    iVar1 = createCollation((sqlite3 *)pCtx,(char *)xCompare,rc._3_1_,zName8,in_RDI,in_RSI);
    sqlite3DbFree((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),db_00);
  }
  iVar1 = sqlite3ApiExit(db_00,0);
  sqlite3_mutex_leave((sqlite3_mutex *)0x14dcbe);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_create_collation16(
  sqlite3* db,
  const void *zName,
  int enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*)
){
  int rc = SQLITE_OK;
  char *zName8;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zName==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  assert( !db->mallocFailed );
  zName8 = sqlite3Utf16to8(db, zName, -1, SQLITE_UTF16NATIVE);
  if( zName8 ){
    rc = createCollation(db, zName8, (u8)enc, pCtx, xCompare, 0);
    sqlite3DbFree(db, zName8);
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}